

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
sjtu::vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_>::doubleSpace
          (vector<std::pair<const_std::pair<unsigned_long_long,_int>,_long>_> *this)

{
  void *pvVar1;
  void *pvVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  long *in_RDI;
  pair<const_std::pair<unsigned_long_long,_int>,_long> *p;
  int i;
  pair<const_std::pair<unsigned_long_long,_int>,_long> *tmp;
  void *local_20;
  int local_14;
  
  pvVar1 = (void *)*in_RDI;
  *(int *)((long)in_RDI + 0xc) = *(int *)((long)in_RDI + 0xc) << 1;
  pvVar2 = operator_new((long)*(int *)((long)in_RDI + 0xc) * 0x18);
  *in_RDI = (long)pvVar2;
  for (local_14 = 0; local_20 = pvVar1, local_14 < (int)in_RDI[1]; local_14 = local_14 + 1) {
    puVar3 = (undefined8 *)(*in_RDI + (long)local_14 * 0x18);
    puVar4 = (undefined8 *)((long)pvVar1 + (long)local_14 * 0x18);
    *puVar3 = *puVar4;
    puVar3[1] = puVar4[1];
    puVar3[2] = puVar4[2];
  }
  for (; local_20 < (void *)((long)pvVar1 + (long)(int)in_RDI[1] * 0x18);
      local_20 = (void *)((long)local_20 + 0x18)) {
  }
  operator_delete(pvVar1);
  return;
}

Assistant:

void doubleSpace() {
                T *tmp = data;
                maxSize *= 2;
                data = (T*) (operator new (maxSize * sizeof(T)));
                for (int i = 0; i < currentLength; ++i)
                        new (data + i) T(tmp[i]);
        for (T* p = tmp; p < tmp + currentLength; ++p)
            p->~T();
                operator delete (tmp);
        }